

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  AuxData *pAuxData;
  int iArg_local;
  sqlite3_context *pCtx_local;
  
  pAuxData = pCtx->pVdbe->pAuxData;
  while( true ) {
    if (pAuxData == (AuxData *)0x0) {
      return (void *)0x0;
    }
    if ((pAuxData->iAuxArg == iArg) && ((pAuxData->iAuxOp == pCtx->iOp || (iArg < 0)))) break;
    pAuxData = pAuxData->pNextAux;
  }
  return pAuxData->pAux;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  AuxData *pAuxData;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return 0;
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#if SQLITE_ENABLE_STAT4
  if( pCtx->pVdbe==0 ) return 0;
#else
  assert( pCtx->pVdbe!=0 );
#endif
  for(pAuxData=pCtx->pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if(  pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      return pAuxData->pAux;
    }
  }
  return 0;
}